

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  ulong uVar2;
  undefined **__n;
  void *__buf;
  int iVar3;
  int in_R8D;
  duration<long,_std::ratio<1L,_1L>_> local_4d0;
  thread t;
  once_flag once;
  tls_stream stream;
  io_context ctx;
  stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>
  local_498;
  context ssl_ctx;
  string local_468;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  string local_420 [32];
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_400;
  resolver resolver;
  session<boost::beast::websocket::stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>_>
  session;
  url local_1b0;
  url url;
  
  boost::asio::ssl::context::context(&ssl_ctx,tlsv12_client);
  once._M_once = 0;
  m2d::root_cert_abi_cxx11_();
  std::
  call_once<void(&)(std::__cxx11::string_const&,boost::asio::ssl::context&),std::__cxx11::string_const,boost::asio::ssl::context&>
            (&once,m2d::savanna::load_root_cert,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&session,&ssl_ctx)
  ;
  std::__cxx11::string::~string((string *)&session);
  boost::asio::io_context::io_context(&ctx);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&resolver.impl_,&ctx,(type *)0x0);
  std::__cxx11::string::string
            ((string *)&local_468,"wss://echo.websocket.org",(allocator *)&session);
  m2d::savanna::url::url(&url,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  boost::beast::websocket::
  stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,true>
  ::stream<boost::asio::io_context&,boost::asio::ssl::context&>
            ((stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,true>
              *)&stream,&ctx,&ssl_ctx);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl(&local_400,&resolver.impl_);
  local_498.impl_.px = stream.impl_.px;
  local_498.impl_.pn.pi_ = stream.impl_.pn.pi_;
  stream.impl_.px = (element_type *)0x0;
  stream.impl_.pn.pi_ = (sp_counted_base *)0x0;
  m2d::savanna::url::url(&local_1b0,&url);
  m2d::savanna::websocket::
  session<boost::beast::websocket::stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>_>
  ::session(&session,(resolver *)&local_400,&local_498,&local_1b0);
  m2d::savanna::url::~url(&local_1b0);
  boost::beast::websocket::
  stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>
  ::~stream(&local_498);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_400);
  local_448._M_unused._M_object = (void *)0x0;
  local_448._8_8_ = 0;
  local_430 = std::
              _Function_handler<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/example/websocket/main.cpp:31:21)>
              ::_M_invoke;
  local_438 = std::
              _Function_handler<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/0x0c[P]savanna/example/websocket/main.cpp:31:21)>
              ::_M_manager;
  boost::optional_detail::
  optional_base<std::function<void_(boost::beast::basic_flat_buffer<std::allocator<char>_>_&)>_>::
  assign(&session.on_message_handler_.super_type,(argument_type)&local_448);
  std::_Function_base::~_Function_base((_Function_base *)&local_448);
  t._M_id._M_thread = (id)0;
  local_4d0.__r = (rep)operator_new(0x10);
  __n = &PTR___State_001ec730;
  *(undefined ***)local_4d0.__r = &PTR___State_001ec730;
  *(session<boost::beast::websocket::stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>_>
    **)(local_4d0.__r + 8) = &session;
  std::thread::_M_start_thread(&t,&local_4d0,0);
  if ((long *)local_4d0.__r != (long *)0x0) {
    (**(code **)(*(long *)local_4d0.__r + 8))();
  }
  std::thread::detach();
  iVar3 = -3;
  do {
    if (session.current_state_ == connected) {
      do {
        poVar1 = std::operator<<((ostream *)&std::cout,"send: hello");
        std::endl<char,std::char_traits<char>>(poVar1);
        std::__cxx11::string::string(local_420,"hello",(allocator *)&local_4d0);
        uVar2 = m2d::savanna::websocket::
                session<boost::beast::websocket::stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>_>
                ::send(&session,(int)local_420,__buf,(size_t)__n,in_R8D);
        std::__cxx11::string::~string(local_420);
        if ((uVar2 >> 0x20 & 1) != 0) {
          poVar1 = std::operator<<((ostream *)&std::cout,"error code: ");
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)uVar2);
          std::endl<char,std::char_traits<char>>(poVar1);
        }
        local_4d0.__r = 1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_4d0);
      } while( true );
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"connecting...");
    std::endl<char,std::char_traits<char>>(poVar1);
    local_4d0.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_4d0);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  std::thread::~thread(&t);
  m2d::savanna::websocket::
  session<boost::beast::websocket::stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>_>
  ::~session(&session);
  boost::beast::websocket::
  stream<boost::beast::ssl_stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_true>
  ::~stream(&stream);
  m2d::savanna::url::~url(&url);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&resolver.impl_);
  boost::asio::execution_context::~execution_context(&ctx.super_execution_context);
  boost::asio::ssl::context::~context(&ssl_ctx);
  return -1;
}

Assistant:

int main(int argc, char *argv[])
{
	ssl::context ssl_ctx(ssl::context::tlsv12_client);
	std::once_flag once;
	std::call_once(once, savanna::load_root_cert, m2d::root_cert(), ssl_ctx);

	net::io_context ctx;
	tcp::resolver resolver(ctx);

	// savanna::url url("ws://echo.websocket.org");
	// auto stream = savanna::websocket::raw_stream(ctx);
	// savanna::websocket::session<savanna::websocket::raw_stream> session(std::move(resolver), std::move(stream), url);

	savanna::url url("wss://echo.websocket.org");
	auto stream = savanna::websocket::tls_stream(ctx, ssl_ctx);
	savanna::websocket::session<savanna::websocket::tls_stream> session(std::move(resolver), std::move(stream), url);

	session.on_message([](beast::flat_buffer buffer) {
		std::cout << "received: " << beast::make_printable(buffer.data()) << std::endl;
	});

	std::thread t([&]() {
		try {
			session.run();
		} catch (boost::wrapexcept<boost::system::system_error> e) {
			std::cout << "Error: " << e.what() << std::endl;
		}
	});
	t.detach();

	int retry_count = 3;
	while (session.current_state() != savanna::websocket::state::connected && retry_count > 0) {
		std::cout << "connecting..." << std::endl;
		std::this_thread::sleep_for(std::chrono::seconds(1));
		retry_count--;
		if (retry_count == 0) {
			return -1;
		}
	}

	while (true) {
		std::cout << "send: hello" << std::endl;
		auto ec = session.send("hello");
		if (ec) {
			std::cout << "error code: " << ec.value() << std::endl;
		}
		std::this_thread::sleep_for(std::chrono::seconds(1));
	}

	return 0;
}